

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

long * __thiscall
dlib::matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
operator()(matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
           *this,long r,long c)

{
  long *plVar1;
  long in_RDX;
  long in_RSI;
  layout<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_1> *in_RDI;
  
  plVar1 = row_major_layout::layout<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_1>
           ::operator()(in_RDI,in_RSI,in_RDX);
  return plVar1;
}

Assistant:

T& operator() (
            long r, 
            long c
        ) 
        { 
            DLIB_ASSERT(r < nr() && c < nc() &&
                   r >= 0 && c >= 0, 
                "\tT& matrix::operator(r,c)"
                << "\n\tYou must give a valid row and column"
                << "\n\tr:    " << r 
                << "\n\tc:    " << c
                << "\n\tnr(): " << nr()
                << "\n\tnc(): " << nc() 
                << "\n\tthis: " << this
                );
            return data(r,c); 
        }